

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Error * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Error,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,AST **args_2)

{
  Error *lr;
  Fodder *in_RDI;
  Error *r;
  AST *in_stack_ffffffffffffffa8;
  Error *in_stack_ffffffffffffffc0;
  
  lr = (Error *)operator_new(0x88);
  Error::Error(in_stack_ffffffffffffffc0,(LocationRange *)lr,in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)lr,
             (value_type *)lr);
  return lr;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }